

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O1

bool __thiscall QFontDef::operator<(QFontDef *this,QFontDef *other)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  _Rb_tree_color _Var5;
  ulong uVar6;
  ulong uVar7;
  QString *pQVar8;
  QString *pQVar9;
  compare_eq_result_container<QList<QString>,_QString> cVar10;
  bool bVar11;
  byte extraout_var;
  size_t sVar12;
  _Rb_tree_node_base *p_Var13;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar14;
  size_t sVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar20;
  _Rb_tree_node_base *p_Var21;
  byte bVar22;
  bool bVar23;
  QStringView QVar24;
  QStringView QVar25;
  
  dVar3 = this->pixelSize;
  dVar4 = other->pixelSize;
  if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
    bVar22 = dVar3 < dVar4;
  }
  else {
    uVar6 = *(ulong *)&this->field_0x60;
    uVar17 = (uint)(uVar6 >> 0x20);
    uVar16 = uVar17 >> 8 & 0x3ff;
    uVar7 = *(ulong *)&other->field_0x60;
    uVar19 = (uint)(uVar7 >> 0x20);
    uVar18 = uVar19 >> 8 & 0x3ff;
    bVar22 = uVar16 < uVar18;
    if (uVar16 == uVar18) {
      uVar16 = (uint)(uVar6 >> 0x1c) & 3;
      uVar18 = (uint)(uVar7 >> 0x1c) & 3;
      bVar22 = uVar16 < uVar18;
      if ((((uVar16 == uVar18) &&
           (uVar16 = (uint)(uVar6 >> 0x10) & 0xfff, uVar18 = (uint)(uVar7 >> 0x10) & 0xfff,
           bVar22 = uVar16 < uVar18, uVar16 == uVar18)) &&
          (uVar17 = uVar17 & 0xff, uVar19 = uVar19 & 0xff, bVar22 = uVar17 < uVar19,
          uVar17 == uVar19)) &&
         (uVar17 = (uint)uVar6 & 0xffff, uVar19 = (uint)uVar7 & 0xffff, bVar22 = uVar17 < uVar19,
         uVar17 == uVar19)) {
        cVar10 = QList<QString>::operator==(&this->families,&other->families);
        if (!cVar10) {
          pQVar8 = (this->families).d.ptr;
          pQVar9 = (other->families).d.ptr;
          bVar11 = std::
                   __lexicographical_compare_impl<QList<QString>::const_iterator,QList<QString>::const_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                             (pQVar8,pQVar8 + (this->families).d.size,pQVar9,
                              pQVar9 + (other->families).d.size);
          return bVar11;
        }
        bVar11 = operator!=(&this->styleName,&other->styleName);
        if (bVar11) {
          QVar24.m_data = (this->styleName).d.ptr;
          QVar24.m_size = (this->styleName).d.size;
          QVar25.m_data = (other->styleName).d.ptr;
          QVar25.m_size = (other->styleName).d.size;
          QtPrivate::compareStrings(QVar24,QVar25,CaseSensitive);
          bVar22 = extraout_var >> 7;
        }
        else {
          uVar17 = (uint)(*(ulong *)&this->field_0x60 >> 0x1e) & 3;
          uVar19 = (uint)(*(ulong *)&other->field_0x60 >> 0x1e) & 3;
          bVar22 = uVar17 < uVar19;
          if (uVar17 == uVar19) {
            uVar17 = (uint)(*(ulong *)&this->field_0x60 >> 0x20);
            uVar16 = uVar17 >> 0x13 & 1;
            uVar19 = (uint)(*(ulong *)&other->field_0x60 >> 0x20);
            uVar18 = uVar19 >> 0x13 & 1;
            bVar22 = uVar16 < uVar18;
            if ((uVar16 == uVar18) &&
               (uVar17 = uVar17 >> 0x12 & 1, uVar19 = uVar19 >> 0x12 & 1, bVar22 = uVar17 < uVar19,
               uVar17 == uVar19)) {
              bVar11 = comparesEqual<QFont::Tag,_float,_true>
                                 (&this->variableAxisValues,&other->variableAxisValues);
              if (!bVar11) {
                pQVar14 = (this->variableAxisValues).d.d.ptr;
                if (pQVar14 ==
                    (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
                  sVar12 = 0;
                }
                else {
                  sVar12 = (pQVar14->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                }
                pQVar20 = (other->variableAxisValues).d.d.ptr;
                if (pQVar20 ==
                    (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
                  sVar15 = 0;
                }
                else {
                  sVar15 = (pQVar20->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                }
                if (sVar12 != sVar15) {
                  if (pQVar14 ==
                      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                       *)0x0) {
                    sVar12 = 0;
                  }
                  else {
                    sVar12 = (pQVar14->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  }
                  if (pQVar20 ==
                      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                       *)0x0) {
                    sVar15 = 0;
                  }
                  else {
                    sVar15 = (pQVar20->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  }
                  bVar22 = (long)sVar12 < (long)sVar15;
                  goto LAB_00498b46;
                }
                if (pQVar14 ==
                    (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
                  p_Var13 = (_Rb_tree_node_base *)0x0;
                }
                else {
                  p_Var13 = *(_Base_ptr *)
                             ((long)&(pQVar14->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                             0x10);
                }
                if (pQVar20 ==
                    (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
                  pQVar20 = (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)0x0;
                }
                else {
                  pQVar20 = *(QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                              **)((long)&(pQVar20->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                                 0x10);
                }
                p_Var21 = &(pQVar14->m)._M_t._M_impl.super__Rb_tree_header._M_header;
                if (pQVar14 ==
                    (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
                  p_Var21 = (_Rb_tree_node_base *)0x0;
                }
                while( true ) {
                  bVar22 = (byte)pQVar14;
                  if (p_Var13 == p_Var21) break;
                  _Var5 = *(_Rb_tree_color *)
                           &(pQVar20->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  bVar23 = p_Var13[1]._M_color < _Var5;
                  bVar11 = p_Var13[1]._M_color == _Var5;
                  if (!bVar11) {
LAB_00498bf2:
                    bVar22 = !bVar23 && !bVar11;
                    break;
                  }
                  fVar2 = *(float *)&p_Var13[1].field_0x4;
                  pfVar1 = (float *)((long)&(pQVar20->m)._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_left + 4);
                  bVar11 = fVar2 == *pfVar1;
                  bVar23 = fVar2 < *pfVar1;
                  if ((!bVar11) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_00498bf2;
                  p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
                  pQVar14 = (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)std::_Rb_tree_increment((_Rb_tree_node_base *)pQVar20);
                  pQVar20 = pQVar14;
                }
                if (p_Var13 != p_Var21) goto LAB_00498b46;
              }
              bVar22 = 0;
            }
          }
        }
      }
    }
  }
LAB_00498b46:
  return (bool)(bVar22 & 1);
}

Assistant:

inline bool operator<(const QFontDef &other) const
    {
        if (pixelSize != other.pixelSize) return pixelSize < other.pixelSize;
        if (weight != other.weight) return weight < other.weight;
        if (style != other.style) return style < other.style;
        if (stretch != other.stretch) return stretch < other.stretch;
        if (styleHint != other.styleHint) return styleHint < other.styleHint;
        if (styleStrategy != other.styleStrategy) return styleStrategy < other.styleStrategy;
        if (families != other.families) return families < other.families;
        if (styleName != other.styleName)
            return styleName < other.styleName;
        if (hintingPreference != other.hintingPreference) return hintingPreference < other.hintingPreference;


        if (ignorePitch != other.ignorePitch) return ignorePitch < other.ignorePitch;
        if (fixedPitch != other.fixedPitch) return fixedPitch < other.fixedPitch;
        if (variableAxisValues != other.variableAxisValues) {
            if (variableAxisValues.size() != other.variableAxisValues.size())
                return variableAxisValues.size() < other.variableAxisValues.size();

            {
                auto it = variableAxisValues.constBegin();
                auto jt = other.variableAxisValues.constBegin();
                for (; it != variableAxisValues.constEnd(); ++it, ++jt) {
                    if (it.key() != jt.key())
                        return jt.key() < it.key();
                    if (it.value() != jt.value())
                        return jt.value() < it.value();
                }
            }
        }

        return false;
    }